

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O2

REF_STATUS ref_inflate_pri_min_dot(REF_NODE ref_node,REF_INT *nodes,REF_DBL *min_dot)

{
  int iVar1;
  int iVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  double dVar8;
  double dVar9;
  undefined8 uStack_a0;
  undefined8 local_98;
  uint local_90;
  REF_DBL top_normal [3];
  REF_DBL edge [3];
  REF_DBL bot_normal [3];
  
  local_98 = *(ulong *)nodes;
  local_90 = nodes[2];
  uVar4 = ref_node_tri_normal(ref_node,(REF_INT *)&local_98,bot_normal);
  if (uVar4 == 0) {
    uVar4 = ref_math_normalize(bot_normal);
    if (uVar4 == 0) {
      local_98 = *(ulong *)(nodes + 3);
      local_90 = nodes[5];
      uVar4 = ref_node_tri_normal(ref_node,(REF_INT *)&local_98,top_normal);
      if (uVar4 == 0) {
        uVar4 = ref_math_normalize(top_normal);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                 ,0x3e,"ref_inflate_pri_min_dot",(ulong)uVar4,"norm top");
          printf("%d %d %d %f %f %f\n",top_normal[0],top_normal[1],top_normal[2],
                 local_98 & 0xffffffff,local_98 >> 0x20,(ulong)local_90);
          pRVar3 = ref_node->real;
          lVar5 = (long)(int)local_98;
          printf("%f %f %f\n",pRVar3[lVar5 * 0xf],pRVar3[lVar5 * 0xf + 1],pRVar3[lVar5 * 0xf + 2]);
          pRVar3 = ref_node->real;
          lVar5 = (long)local_98._4_4_;
          printf("%f %f %f\n",pRVar3[lVar5 * 0xf],pRVar3[lVar5 * 0xf + 1],pRVar3[lVar5 * 0xf + 2]);
          pRVar3 = ref_node->real;
          lVar5 = (long)(int)local_90;
          printf("%f %f %f\n",pRVar3[lVar5 * 0xf],pRVar3[lVar5 * 0xf + 1],pRVar3[lVar5 * 0xf + 2]);
          return uVar4;
        }
        *min_dot = 1.0;
        lVar5 = 0;
        while( true ) {
          if (lVar5 == 3) {
            return 0;
          }
          iVar1 = nodes[lVar5 + 3];
          pRVar3 = ref_node->real;
          iVar2 = nodes[lVar5];
          for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
            edge[lVar6] = pRVar3[iVar1 * 0xf + lVar6] - pRVar3[iVar2 * 0xf + lVar6];
          }
          uVar4 = ref_math_normalize(edge);
          if (uVar4 != 0) break;
          dVar9 = bot_normal[2] * edge[2] + bot_normal[0] * edge[0] + bot_normal[1] * edge[1];
          dVar8 = *min_dot;
          if (dVar9 <= *min_dot) {
            dVar8 = dVar9;
          }
          dVar9 = edge[2] * top_normal[2] + edge[0] * top_normal[0] + edge[1] * top_normal[1];
          if (dVar9 <= dVar8) {
            dVar8 = dVar9;
          }
          *min_dot = dVar8;
          lVar5 = lVar5 + 1;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
               0x46,"ref_inflate_pri_min_dot",(ulong)uVar4,"norm edge0");
        return uVar4;
      }
      pcVar7 = "top";
      uStack_a0 = 0x31;
    }
    else {
      pcVar7 = "norm bot";
      uStack_a0 = 0x2c;
    }
  }
  else {
    pcVar7 = "bot";
    uStack_a0 = 0x2b;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
         uStack_a0,"ref_inflate_pri_min_dot",(ulong)uVar4,pcVar7);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_pri_min_dot(REF_NODE ref_node, REF_INT *nodes,
                                           REF_DBL *min_dot) {
  REF_INT tri_nodes[3];
  REF_DBL top_normal[3];
  REF_DBL bot_normal[3];
  REF_DBL edge[3];
  REF_INT node, i;

  tri_nodes[0] = nodes[0];
  tri_nodes[1] = nodes[1];
  tri_nodes[2] = nodes[2];
  RSS(ref_node_tri_normal(ref_node, tri_nodes, bot_normal), "bot");
  RSS(ref_math_normalize(bot_normal), "norm bot");

  tri_nodes[0] = nodes[3];
  tri_nodes[1] = nodes[4];
  tri_nodes[2] = nodes[5];
  RSS(ref_node_tri_normal(ref_node, tri_nodes, top_normal), "top");
  RSB(ref_math_normalize(top_normal), "norm top", {
    printf("%d %d %d %f %f %f\n", tri_nodes[0], tri_nodes[1], tri_nodes[2],
           top_normal[0], top_normal[1], top_normal[2]);
    printf("%f %f %f\n", ref_node_xyz(ref_node, 0, tri_nodes[0]),
           ref_node_xyz(ref_node, 1, tri_nodes[0]),
           ref_node_xyz(ref_node, 2, tri_nodes[0]));
    printf("%f %f %f\n", ref_node_xyz(ref_node, 0, tri_nodes[1]),
           ref_node_xyz(ref_node, 1, tri_nodes[1]),
           ref_node_xyz(ref_node, 2, tri_nodes[1]));
    printf("%f %f %f\n", ref_node_xyz(ref_node, 0, tri_nodes[2]),
           ref_node_xyz(ref_node, 1, tri_nodes[2]),
           ref_node_xyz(ref_node, 2, tri_nodes[2]));
  });

  *min_dot = 1.0;
  for (node = 0; node < 3; node++) {
    for (i = 0; i < 3; i++) {
      edge[i] = ref_node_xyz(ref_node, i, nodes[node + 3]) -
                ref_node_xyz(ref_node, i, nodes[node]);
    }
    RSS(ref_math_normalize(edge), "norm edge0");
    *min_dot = MIN(*min_dot, ref_math_dot(edge, bot_normal));
    *min_dot = MIN(*min_dot, ref_math_dot(edge, top_normal));
  }

  return REF_SUCCESS;
}